

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry *
NscBuildParameter(CNscPStackEntry *pType,CNscPStackEntry *pId,CNscPStackEntry *pInit)

{
  bool bVar1;
  NscType NVar2;
  UINT32 UVar3;
  CNscPStackEntry *this;
  char *pcVar4;
  size_t *pauchData;
  CNscPStackEntry *in_RDX;
  CNscPStackEntry *in_RSI;
  CNscPStackEntry *in_RDI;
  NscPCodeHeader *ph;
  uchar *pauchInit;
  size_t nInitSize;
  NscType nType;
  CNscPStackEntry *pOut;
  undefined4 in_stack_ffffffffffffff88;
  NscType in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  UINT32 in_stack_ffffffffffffff9c;
  CNscPStackEntry *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  CNscContext *this_00;
  int nFile;
  CNscContext *in_stack_ffffffffffffffb0;
  CNscContext *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  NscType nType_00;
  size_t *psVar5;
  CNscPStackEntry *this_01;
  
  nFile = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  nType_00 = (NscType)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  this = CNscContext::GetPStackEntry
                   ((CNscContext *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
  if (in_RDI == (CNscPStackEntry *)0x0) {
    __assert_fail("pType",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                  ,0x5f3,
                  "CNscPStackEntry *NscBuildParameter(CNscPStackEntry *, CNscPStackEntry *, CNscPStackEntry *)"
                 );
  }
  if (in_RSI != (CNscPStackEntry *)0x0) {
    NVar2 = CNscPStackEntry::GetType(in_RDI);
    if (((NVar2 == NscType_Error) ||
        (NVar2 = CNscPStackEntry::GetType(in_RSI), NVar2 == NscType_Error)) ||
       ((in_RDX != (CNscPStackEntry *)0x0 &&
        (NVar2 = CNscPStackEntry::GetType(in_RDX), NVar2 == NscType_Error)))) {
      CNscPStackEntry::SetType
                ((CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
    }
    else {
      bVar1 = CNscContext::IsPhase2(g_pCtx);
      if ((bVar1) || (bVar1 = CNscContext::IsNWScript(g_pCtx), bVar1)) {
        NVar2 = CNscPStackEntry::GetType(in_RDI);
        UVar3 = CNscPStackEntry::GetFlags(in_RDI);
        if ((UVar3 & 0x80) != 0) {
          in_stack_ffffffffffffffb8 = g_pCtx;
          pcVar4 = CNscPStackEntry::GetIdentifier(in_RSI);
          CNscContext::GenerateMessage
                    (in_stack_ffffffffffffffb8,NscMessage_ErrorConstIllegalOnParameter,pcVar4);
        }
        this_01 = (CNscPStackEntry *)0x0;
        psVar5 = (size_t *)0x0;
        if (in_RDX != (CNscPStackEntry *)0x0) {
          this_01 = (CNscPStackEntry *)CNscPStackEntry::GetDataSize(in_RDX);
          pauchData = (size_t *)CNscPStackEntry::GetData(in_RDX);
          NscSimplifyConstant((uchar *)pauchData,(size_t *)&stack0xffffffffffffffd0);
          psVar5 = pauchData;
          if (((CNscPStackEntry *)*pauchData == this_01) && ((int)pauchData[1] == 0x34)) {
            bVar1 = CNscContext::IsNWScript(g_pCtx);
            if (((bVar1) && (*(int *)((long)pauchData + 0xc) == 6)) && (NVar2 == NscType_Object)) {
              CNscPStackEntry::SetDataSize
                        ((CNscPStackEntry *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
              nType_00 = (NscType)((ulong)pauchData >> 0x20);
              CNscPStackEntry::PushConstantObject
                        (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
            }
            else {
              if (*(NscType *)((long)pauchData + 0xc) != NVar2) {
                CNscPStackEntry::SetType
                          ((CNscPStackEntry *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff8c);
                this_00 = g_pCtx;
                pcVar4 = CNscPStackEntry::GetIdentifier(in_RSI);
                CNscContext::GenerateMessage(this_00,NscMessage_ErrorParamDeclTypeMismatch,pcVar4);
                nFile = (int)((ulong)this_00 >> 0x20);
              }
              nType_00 = (NscType)((ulong)pauchData >> 0x20);
            }
          }
          else {
            CNscPStackEntry::SetType
                      ((CNscPStackEntry *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff8c);
            nType_00 = (NscType)((ulong)pauchData >> 0x20);
            in_stack_ffffffffffffffb0 = g_pCtx;
            pcVar4 = CNscPStackEntry::GetIdentifier(in_RSI);
            CNscContext::GenerateMessage
                      (in_stack_ffffffffffffffb0,NscMessage_ErrorParamDefaultInitNotConstExp,pcVar4)
            ;
          }
        }
        NVar2 = CNscPStackEntry::GetType(this);
        if (NVar2 != NscType_Error) {
          CNscPStackEntry::SetType
                    ((CNscPStackEntry *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c);
          CNscPStackEntry::GetIdentifier(in_RSI);
          in_stack_ffffffffffffff88 = 0xffffffff;
          in_stack_ffffffffffffff90 = 0;
          CNscPStackEntry::PushDeclaration
                    (this_01,(char *)psVar5,nType_00,(uchar *)in_stack_ffffffffffffffb8,
                     (size_t)in_stack_ffffffffffffffb0,nFile,(int)this,(UINT32)in_RDX);
        }
      }
    }
    CNscContext::FreePStackEntry
              ((CNscContext *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    CNscContext::FreePStackEntry
              ((CNscContext *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (in_RDX != (CNscPStackEntry *)0x0) {
      CNscContext::FreePStackEntry
                ((CNscContext *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    return this;
  }
  __assert_fail("pId",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                ,0x5f4,
                "CNscPStackEntry *NscBuildParameter(CNscPStackEntry *, CNscPStackEntry *, CNscPStackEntry *)"
               );
}

Assistant:

YYSTYPE NscBuildParameter (YYSTYPE pType, YYSTYPE pId, YYSTYPE pInit)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// Validate what we should have
	//

	assert (pType);
	assert (pId);

	//
	// Check for silent errors
	//

	if (pType ->GetType () == NscType_Error ||
		pId ->GetType () == NscType_Error ||
		(pInit != NULL && pInit ->GetType () == NscType_Error))
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, we are ok
	//

	else if (g_pCtx ->IsPhase2 () || g_pCtx ->IsNWScript ())
	{

		NscType nType = pType ->GetType ();

		//
		// Check for constant type
		//

		if ((pType ->GetFlags () & NscSymFlag_Constant) != 0)
		{
			g_pCtx ->GenerateMessage (NscMessage_ErrorConstIllegalOnParameter,
				pId ->GetIdentifier ());
		}

		//
		// If we have an initialization, the validate
		//

		size_t nInitSize = 0;
		unsigned char *pauchInit = NULL;

		//
		// If there is an initializer
		//

		if (pInit)
		{
			
			//
			// Get the initializer
			//

			nInitSize = pInit ->GetDataSize ();
			pauchInit = pInit ->GetData ();

			//
			// Simplify the constant on the parameter list
			// to check for unary minus values
			//

			NscSimplifyConstant (pauchInit, nInitSize);

			//
			// If not a simple value, then issue error
			//

			NscPCodeHeader *ph = (NscPCodeHeader *) pauchInit;
			if (ph ->nOpSize != nInitSize ||
				ph ->nOpCode != NscPCode_Constant)
			{
				pOut ->SetType (NscType_Error);
				g_pCtx ->GenerateMessage (
					NscMessage_ErrorParamDefaultInitNotConstExp,
					pId ->GetIdentifier ());
			}

			//
			// If this is NWScript and we have object = int, then
			// adjust.
			//
			// NOTE: The NWScript prototype for SpeakOneLinerConversation
			//		uses a default value of OBJECT_TYPE_INVALID for and 
			//		object.  The problem is OBJECT_TYPE_INVALID is WRONG and
			//		really should be OBJECT_INVALID.
			//

			else if (g_pCtx ->IsNWScript () && 
				ph ->nType == NscType_Integer &&
				nType == NscType_Object)
			{
				pInit ->SetDataSize (0);
				pInit ->PushConstantObject (0x7F000000);
			}

			//
			// Validate that we have a matching type
			//

			else if (ph ->nType != nType)
			{
				pOut ->SetType (NscType_Error);
				g_pCtx ->GenerateMessage (NscMessage_ErrorParamDeclTypeMismatch,
					pId ->GetIdentifier ());
			}
		}

		//
		// If we didn't generate an error
		//

		if (pOut ->GetType () != NscType_Error)
		{
			pOut ->SetType (nType);
			pOut ->PushDeclaration (pId ->GetIdentifier (),
				nType, pauchInit, nInitSize, -1, -1, 0);
		}
	}

	//
	// Rundown
	//

	g_pCtx ->FreePStackEntry (pType);
    g_pCtx ->FreePStackEntry (pId);
	if (pInit)
         g_pCtx ->FreePStackEntry (pInit);

	//
	// Return results
	//

	return pOut;
}